

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode parse_hostname_login(Curl_URL *u,dynbuf *host,uint flags)

{
  dynbuf *s;
  _Bool _Var1;
  CURLcode CVar2;
  char *__s;
  char *pcVar3;
  size_t trail;
  Curl_handler **local_78;
  char *ptr;
  char *login;
  Curl_handler *h;
  char *optionsp;
  char *passwdp;
  char *userp;
  CURLUcode local_28;
  CURLcode ccode;
  CURLUcode result;
  uint flags_local;
  dynbuf *host_local;
  Curl_URL *u_local;
  
  local_28 = CURLUE_OK;
  passwdp = (char *)0x0;
  optionsp = (char *)0x0;
  h = (Curl_handler *)0x0;
  login = (char *)0x0;
  ccode = flags;
  _result = host;
  host_local = (dynbuf *)u;
  __s = Curl_dyn_ptr(host);
  pcVar3 = strchr(__s,0x40);
  if (pcVar3 != (char *)0x0) {
    if (host_local->bufr != (char *)0x0) {
      login = (char *)Curl_builtin_scheme(host_local->bufr,0xffffffffffffffff);
    }
    if ((login == (char *)0x0) || ((*(uint *)(login + 0x8c) & 0x400) == 0)) {
      local_78 = (Curl_handler **)0x0;
    }
    else {
      local_78 = &h;
    }
    userp._4_4_ = Curl_parse_login_details
                            (__s,(size_t)(pcVar3 + 1 + (-1 - (long)__s)),&passwdp,&optionsp,
                             (char **)local_78);
    if (userp._4_4_ == CURLE_OK) {
      if (passwdp != (char *)0x0) {
        if ((ccode & CURLE_OBSOLETE32) != CURLE_OK) {
          local_28 = CURLUE_USER_NOT_ALLOWED;
          goto LAB_0013d4e5;
        }
        _Var1 = junkscan(passwdp,ccode);
        if (_Var1) {
          local_28 = CURLUE_BAD_USER;
          goto LAB_0013d4e5;
        }
        host_local->leng = (size_t)passwdp;
      }
      if (optionsp != (char *)0x0) {
        _Var1 = junkscan(optionsp,ccode);
        if (_Var1) {
          local_28 = CURLUE_BAD_PASSWORD;
          goto LAB_0013d4e5;
        }
        host_local->allc = (size_t)optionsp;
      }
      if (h != (Curl_handler *)0x0) {
        _Var1 = junkscan((char *)h,ccode);
        if (_Var1) {
          local_28 = CURLUE_BAD_LOGIN;
          goto LAB_0013d4e5;
        }
        host_local->toobig = (size_t)h;
      }
      s = _result;
      trail = strlen(pcVar3 + 1);
      CVar2 = Curl_dyn_tail(s,trail);
      if (CVar2 != CURLE_OK) {
        return CURLUE_OUT_OF_MEMORY;
      }
      return CURLUE_OK;
    }
    local_28 = CURLUE_BAD_LOGIN;
  }
LAB_0013d4e5:
  (*Curl_cfree)(passwdp);
  (*Curl_cfree)(optionsp);
  (*Curl_cfree)(h);
  host_local->leng = 0;
  host_local->allc = 0;
  host_local->toobig = 0;
  return local_28;
}

Assistant:

static CURLUcode parse_hostname_login(struct Curl_URL *u,
                                      struct dynbuf *host,
                                      unsigned int flags)
{
  CURLUcode result = CURLUE_OK;
  CURLcode ccode;
  char *userp = NULL;
  char *passwdp = NULL;
  char *optionsp = NULL;
  const struct Curl_handler *h = NULL;

  /* At this point, we assume all the other special cases have been taken
   * care of, so the host is at most
   *
   *   [user[:password][;options]]@]hostname
   *
   * We need somewhere to put the embedded details, so do that first.
   */

  char *login = Curl_dyn_ptr(host);
  char *ptr;

  DEBUGASSERT(login);

  ptr = strchr(login, '@');
  if(!ptr)
    goto out;

  /* We will now try to extract the
   * possible login information in a string like:
   * ftp://user:password@ftp.my.site:8021/README */
  ptr++;

  /* if this is a known scheme, get some details */
  if(u->scheme)
    h = Curl_builtin_scheme(u->scheme, CURL_ZERO_TERMINATED);

  /* We could use the login information in the URL so extract it. Only parse
     options if the handler says we should. Note that 'h' might be NULL! */
  ccode = Curl_parse_login_details(login, ptr - login - 1,
                                   &userp, &passwdp,
                                   (h && (h->flags & PROTOPT_URLOPTIONS)) ?
                                   &optionsp:NULL);
  if(ccode) {
    result = CURLUE_BAD_LOGIN;
    goto out;
  }

  if(userp) {
    if(flags & CURLU_DISALLOW_USER) {
      /* Option DISALLOW_USER is set and url contains username. */
      result = CURLUE_USER_NOT_ALLOWED;
      goto out;
    }
    if(junkscan(userp, flags)) {
      result = CURLUE_BAD_USER;
      goto out;
    }
    u->user = userp;
  }

  if(passwdp) {
    if(junkscan(passwdp, flags)) {
      result = CURLUE_BAD_PASSWORD;
      goto out;
    }
    u->password = passwdp;
  }

  if(optionsp) {
    if(junkscan(optionsp, flags)) {
      result = CURLUE_BAD_LOGIN;
      goto out;
    }
    u->options = optionsp;
  }

  /* move the name to the start of the host buffer */
  if(Curl_dyn_tail(host, strlen(ptr)))
    return CURLUE_OUT_OF_MEMORY;

  return CURLUE_OK;
  out:

  free(userp);
  free(passwdp);
  free(optionsp);
  u->user = NULL;
  u->password = NULL;
  u->options = NULL;

  return result;
}